

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPUState.cpp
# Opt level: O1

void __thiscall CPUState::setIndexX(CPUState *this,uint16_t newValue,bool ignoreRegisterSize)

{
  undefined3 in_register_00000011;
  
  if ((CONCAT31(in_register_00000011,ignoreRegisterSize) == 0) &&
     ((this->m_FlagRegister & 0x10) != 0)) {
    *(char *)&this->m_IndexX = (char)newValue;
    return;
  }
  this->m_IndexX = newValue;
  return;
}

Assistant:

void CPUState::setIndexX(uint16_t newValue, bool ignoreRegisterSize) {
    if (ignoreRegisterSize) {
        m_IndexX = newValue;
    } else {
        if (areFlagsSet(INDEX_SELECT)) {
            //set only the lower byte of m_Accumulator
            m_IndexX = (m_IndexX & 0xFF00) + (newValue & 0x00FF);
        } else {
            m_IndexX = newValue;
        }
    }
}